

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::call_expression::~call_expression(call_expression *this)

{
  call_expression *this_local;
  
  ~call_expression(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

explicit call_expression(const source_extend& extend, expression_ptr&& member, expression_list&& arguments) : expression(extend), member_(std::move(member)), arguments_(std::move(arguments)) {
        assert(member_);
    }